

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

string * __thiscall
Dashel::IPV4Address::hostname_abi_cxx11_(string *__return_storage_ptr__,IPV4Address *this)

{
  uint uVar1;
  hostent *phVar2;
  char *__s;
  allocator<char> *__a;
  allocator<char> local_e;
  allocator<char> local_d;
  uint a2;
  
  uVar1 = this->address;
  a2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  phVar2 = gethostbyaddr(&a2,4,2);
  if (phVar2 == (hostent *)0x0) {
    __s = inet_ntoa((in_addr)a2);
    __a = &local_d;
  }
  else {
    __s = phVar2->h_name;
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string IPV4Address::hostname() const
	{
		unsigned a2 = htonl(address);
		struct hostent* he = gethostbyaddr((const char*)&a2, 4, AF_INET);

		if (he == NULL)
		{
			struct in_addr addr;
			addr.s_addr = a2;
			return std::string(inet_ntoa(addr));
		}
		else
		{
			return std::string(he->h_name);
		}
	}